

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
fasttext::Model::computeHidden(Model *this,vector<int,_std::allocator<int>_> *input,Vector *hidden)

{
  bool bVar1;
  int64_t iVar2;
  element_type *A;
  size_type sVar3;
  Vector *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  Vector *in_RDI;
  undefined1 auVar4 [16];
  undefined1 in_ZMM0 [64];
  const_iterator it;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  Vector *in_stack_ffffffffffffffc0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  Vector *local_18;
  vector<int,_std::allocator<int>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar2 = Vector::size(in_RDX);
  if (iVar2 == (int)in_RDI[6].m_) {
    Vector::zero(local_18);
    local_20._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::cbegin(in_stack_ffffffffffffffb8);
    while( true ) {
      std::vector<int,_std::allocator<int>_>::cend(in_stack_ffffffffffffffb8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffffc0,
                         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffffb8);
      auVar4 = in_ZMM0._0_16_;
      if (!bVar1) break;
      in_stack_ffffffffffffffc0 = local_18;
      A = std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)local_18);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (&local_20);
      Vector::addRow(in_RDI,A,(int64_t)in_stack_ffffffffffffffc0);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_20);
    }
    sVar3 = std::vector<int,_std::allocator<int>_>::size(local_10);
    auVar4 = vcvtusi2sd_avx512f(auVar4,sVar3);
    Vector::mul(local_18,(float)(1.0 / auVar4._0_8_));
    return;
  }
  __assert_fail("hidden.size() == hsz_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/model.cc"
                ,0x6b,
                "void fasttext::Model::computeHidden(const std::vector<int32_t> &, Vector &) const")
  ;
}

Assistant:

void Model::computeHidden(const std::vector<int32_t>& input, Vector& hidden) const {
  assert(hidden.size() == hsz_);
  hidden.zero();
  for (auto it = input.cbegin(); it != input.cend(); ++it) {
    hidden.addRow(*wi_, *it);
  }
  hidden.mul(1.0 / input.size());
}